

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O3

void get_payload(cio_buffered_stream *buffered_stream,void *handler_context,cio_error err,
                cio_read_buffer *buffer,size_t num_bytes)

{
  cio_websocket *websocket;
  
  if (err == CIO_SUCCESS) {
    get_payload_cold_1();
    return;
  }
  if (err == CIO_EOF) {
    handle_error((cio_websocket *)handler_context,CIO_EOF,CIO_WEBSOCKET_CLOSE_NORMAL,
                 "connection closed by other peer");
    return;
  }
  handle_error((cio_websocket *)handler_context,err,CIO_WEBSOCKET_CLOSE_INTERNAL_ERROR,
               "error while reading websocket packet");
  return;
}

Assistant:

static inline bool handled_read_error(struct cio_websocket *websocket, enum cio_error err)
{
	if (cio_unlikely(err != CIO_SUCCESS)) {
		if (err == CIO_EOF) {
			handle_error(websocket, CIO_EOF, CIO_WEBSOCKET_CLOSE_NORMAL, "connection closed by other peer");
		} else {
			handle_error(websocket, err, CIO_WEBSOCKET_CLOSE_INTERNAL_ERROR, "error while reading websocket packet");
		}

		return true;
	}

	return false;
}